

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O2

char * ssh2_pubkey_openssh_str_internal(char *comment,void *v_pub_blob,int pub_len)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  char *pcVar4;
  size_t s;
  int iVar5;
  bool bVar6;
  ptrlen pVar7;
  BinarySource src [1];
  
  src[0].len = (size_t)pub_len;
  src[0].binarysource_ = src;
  src[0].pos = 0;
  src[0].err = BSE_NO_ERROR;
  src[0].data = v_pub_blob;
  pVar7 = BinarySource_get_string(src[0].binarysource_);
  bVar6 = (src[0].binarysource_)->err == BSE_NO_ERROR;
  pcVar4 = "INVALID-ALGORITHM";
  if (bVar6) {
    pcVar4 = (char *)pVar7.ptr;
  }
  s = 0x11;
  if (bVar6) {
    s = pVar7.len;
  }
  iVar5 = 0;
  if (comment == (char *)0x0) {
    sVar3 = 0;
  }
  else {
    sVar3 = strlen(comment);
  }
  __s = (char *)safemalloc(sVar3 + s + (long)(int)((pub_len + 2) / 3 << 2 | 3),1,0);
  uVar1 = string_length_for_printf(s);
  iVar2 = sprintf(__s,"%.*s ",(ulong)uVar1,pcVar4);
  pcVar4 = __s + iVar2;
  for (; iVar2 = pub_len - iVar5, iVar2 != 0 && iVar5 <= pub_len; iVar5 = iVar5 + iVar2) {
    if (2 < iVar2) {
      iVar2 = 3;
    }
    base64_encode_atom((uchar *)((long)iVar5 + (long)v_pub_blob),iVar2,pcVar4);
    pcVar4 = pcVar4 + 4;
  }
  if (comment == (char *)0x0) {
    *pcVar4 = '\0';
  }
  else {
    *pcVar4 = ' ';
    strcpy(pcVar4 + 1,comment);
  }
  return __s;
}

Assistant:

static char *ssh2_pubkey_openssh_str_internal(const char *comment,
                                              const void *v_pub_blob,
                                              int pub_len)
{
    const unsigned char *ssh2blob = (const unsigned char *)v_pub_blob;
    ptrlen alg;
    char *buffer, *p;
    int i;

    {
        BinarySource src[1];
        BinarySource_BARE_INIT(src, ssh2blob, pub_len);
        alg = get_string(src);
        if (get_err(src)) {
            const char *replacement_str = "INVALID-ALGORITHM";
            alg.ptr = replacement_str;
            alg.len = strlen(replacement_str);
        }
    }

    buffer = snewn(alg.len +
                   4 * ((pub_len+2) / 3) +
                   (comment ? strlen(comment) : 0) + 3, char);
    p = buffer + sprintf(buffer, "%.*s ", PTRLEN_PRINTF(alg));
    i = 0;
    while (i < pub_len) {
        int n = (pub_len - i < 3 ? pub_len - i : 3);
        base64_encode_atom(ssh2blob + i, n, p);
        i += n;
        p += 4;
    }
    if (comment) {
        *p++ = ' ';
        strcpy(p, comment);
    } else
        *p++ = '\0';

    return buffer;
}